

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O3

pair<QPDFObjectHandle,_bool> *
QPDFParser::parse(pair<QPDFObjectHandle,_bool> *__return_storage_ptr__,OffsetBuffer *input,
                 int stream_id,int obj_id,Tokenizer *tokenizer,QPDF *context)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool empty;
  QPDFObjectHandle result;
  bool local_119;
  Tokenizer *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  long *local_108 [2];
  long local_f8 [2];
  undefined1 local_e8 [16];
  OffsetBuffer *local_d8;
  string *local_d0;
  Tokenizer *local_c8;
  element_type *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  undefined1 local_a0;
  int local_9c;
  int local_98;
  undefined1 local_94;
  vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_> local_90;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined8 local_6c;
  longlong local_60;
  undefined4 local_58;
  qpdf_offset_t local_50;
  qpdf_offset_t qStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_119 = false;
  local_118 = tokenizer;
  local_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)context;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002edbd8;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)CONCAT44(obj_id,stream_id);
  *(undefined1 *)&p_Var1[4]._M_use_count = 3;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"");
  local_b0 = p_Var1 + 1;
  local_c8 = local_118;
  local_c0 = (element_type *)0x0;
  local_b8._M_pi = local_110;
  local_a0 = 1;
  local_94 = 0;
  local_90.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (StackFrame *)0x0;
  local_90.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_78._0_4_ = 0;
  uStack_78._4_4_ = 0;
  local_70 = 0;
  local_6c = 0xf;
  local_60 = 0;
  local_58 = 0;
  local_50 = 0;
  qStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_d8 = input;
  local_d0 = (string *)local_108;
  local_a8 = p_Var1;
  local_9c = stream_id;
  local_98 = obj_id;
  parse((QPDFParser *)local_e8,(bool *)(local_e8 + 0x10),SUB81(&local_119,0));
  std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::~vector(&local_90);
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  (__return_storage_ptr__->first).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_e8._0_8_
  ;
  (__return_storage_ptr__->first).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
  if ((string *)local_e8._8_8_ == (string *)0x0) {
    __return_storage_ptr__->second = local_119;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_e8._8_8_ + 8) = (int)*(size_type *)(local_e8._8_8_ + 8) + 1;
      UNLOCK();
      __return_storage_ptr__->second = local_119;
      if ((string *)local_e8._8_8_ == (string *)0x0) {
        return __return_storage_ptr__;
      }
    }
    else {
      *(int *)(local_e8._8_8_ + 8) = (int)*(size_type *)(local_e8._8_8_ + 8) + 1;
      __return_storage_ptr__->second = local_119;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<QPDFObjectHandle, bool>
QPDFParser::parse(
    is::OffsetBuffer& input, int stream_id, int obj_id, qpdf::Tokenizer& tokenizer, QPDF& context)
{
    bool empty{false};
    auto result = QPDFParser(
                      input,
                      std::make_shared<QPDFObject::Description>(
                          QPDFObject::ObjStreamDescr(stream_id, obj_id)),
                      "",
                      tokenizer,
                      nullptr,
                      &context,
                      true,
                      stream_id,
                      obj_id)
                      .parse(empty, false);
    return {result, empty};
}